

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_xonly_pubkey *pubkey)

{
  secp256k1_fe *r_00;
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  secp256k1_scalar sVar3;
  secp256k1_gej *r_01;
  uchar *data;
  secp256k1_gej *data_00;
  secp256k1_fe *r_02;
  secp256k1_scalar *data_01;
  secp256k1_scalar s;
  int overflow;
  secp256k1_scalar e;
  secp256k1_fe rx;
  uchar buf [32];
  secp256k1_ge pk;
  secp256k1_gej pkj;
  secp256k1_gej rj;
  secp256k1_fe aux [4];
  secp256k1_ge r;
  secp256k1_ge pre_a [4];
  uchar auStack_980 [32];
  secp256k1_sha256 sStack_960;
  secp256k1_fe *psStack_8f0;
  uchar *puStack_8e8;
  secp256k1_scalar *psStack_8e0;
  secp256k1_gej *psStack_8d8;
  code *pcStack_8d0;
  secp256k1_scalar local_8bc;
  int local_8b8;
  secp256k1_scalar local_8b4;
  secp256k1_fe local_8b0;
  secp256k1_strauss_state local_880;
  uchar local_868 [40];
  secp256k1_ge local_840;
  secp256k1_gej local_7d8;
  secp256k1_gej local_740;
  secp256k1_fe local_6a8 [4];
  undefined1 local_5e8 [92];
  int local_58c;
  int local_588;
  secp256k1_ge local_1d8 [4];
  
  if (ctx == (secp256k1_context *)0x0) {
    pcStack_8d0 = (code *)0x10f46f;
    secp256k1_schnorrsig_verify_cold_5();
  }
  else if (sig64 != (uchar *)0x0) {
    if (msglen != 0 && msg == (uchar *)0x0) {
      pcStack_8d0 = (code *)0x10f484;
      secp256k1_schnorrsig_verify_cold_3();
      return 0;
    }
    if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
      pcStack_8d0 = (code *)0x10f491;
      secp256k1_schnorrsig_verify_cold_2();
      return 0;
    }
    pcStack_8d0 = (code *)0x10f29d;
    secp256k1_fe_impl_set_b32_mod(&local_8b0,sig64);
    bVar1 = (local_8b0.n[2] & local_8b0.n[3] & local_8b0.n[1]) == 0xfffffffffffff;
    if (0xffffefffffc2e < local_8b0.n[0] && (bVar1 && local_8b0.n[4] == 0xffffffffffff)) {
      local_8b0.magnitude = -1;
    }
    else {
      local_8b0.magnitude = 1;
      local_8b0.normalized = 1;
      pcStack_8d0 = (code *)0x10f300;
      secp256k1_fe_verify(&local_8b0);
    }
    if (0xffffefffffc2e < local_8b0.n[0] && (bVar1 && local_8b0.n[4] == 0xffffffffffff)) {
      return 0;
    }
    pcStack_8d0 = (code *)0x10f31d;
    secp256k1_scalar_set_b32(&local_8bc,sig64 + 0x20,&local_8b8);
    if (local_8b8 != 0) {
      return 0;
    }
    pcStack_8d0 = (code *)0x10f349;
    iVar2 = secp256k1_pubkey_load(ctx,&local_840,(secp256k1_pubkey *)pubkey);
    if (iVar2 == 0) {
      return 0;
    }
    pcStack_8d0 = (code *)0x10f365;
    secp256k1_fe_get_b32(local_868,&local_840.x);
    pcStack_8d0 = (code *)0x10f37e;
    secp256k1_schnorrsig_challenge(&local_8b4,sig64,msg,msglen,local_868);
    pcStack_8d0 = (code *)0x10f386;
    secp256k1_scalar_verify(&local_8b4);
    sVar3 = 0xd - local_8b4;
    if (local_8b4 == 0) {
      sVar3 = 0;
    }
    pcStack_8d0 = (code *)0x10f3a2;
    local_8b4 = sVar3;
    secp256k1_scalar_verify(&local_8b4);
    r_01 = &local_7d8;
    pcStack_8d0 = (code *)0x10f3b5;
    secp256k1_gej_set_ge(r_01,&local_840);
    local_880.aux = local_6a8;
    local_880.pre_a = local_1d8;
    local_880.ps = (secp256k1_strauss_point_state *)local_5e8;
    pcStack_8d0 = (code *)0x10f3fd;
    data_01 = &local_8b4;
    secp256k1_ecmult_strauss_wnaf(&local_880,&local_740,1,r_01,&local_8b4,&local_8bc);
    pcStack_8d0 = (code *)0x10f410;
    data_00 = &local_740;
    secp256k1_ge_set_gej_var((secp256k1_ge *)local_5e8,&local_740);
    pcStack_8d0 = (code *)0x10f418;
    secp256k1_ge_verify((secp256k1_ge *)local_5e8);
    if (local_588 != 0) {
      return 0;
    }
    r_00 = (secp256k1_fe *)(local_5e8 + 0x30);
    pcStack_8d0 = (code *)0x10f432;
    secp256k1_fe_normalize_var(r_00);
    pcStack_8d0 = (code *)0x10f43a;
    r_02 = r_00;
    secp256k1_fe_verify(r_00);
    if (local_58c == 0) {
      pcStack_8d0 = secp256k1_schnorrsig_challenge;
      secp256k1_schnorrsig_verify_cold_1();
      sStack_960.s[0] = 0x9cecba11;
      sStack_960.s[1] = 0x23925381;
      sStack_960.s[2] = 0x11679112;
      sStack_960.s[3] = 0xd1627e0f;
      sStack_960.s[4] = 0x97c87550;
      sStack_960.s[5] = 0x3cc765;
      sStack_960.s[6] = 0x90f61164;
      sStack_960.s[7] = 0x33e9b66a;
      sStack_960.bytes = 0x40;
      psStack_8f0 = r_00;
      puStack_8e8 = sig64;
      psStack_8e0 = &local_8b4;
      psStack_8d8 = &local_740;
      pcStack_8d0 = (code *)msg;
      secp256k1_sha256_write(&sStack_960,(uchar *)data_00,0x20);
      secp256k1_sha256_write(&sStack_960,(uchar *)data_01,0x20);
      secp256k1_sha256_write(&sStack_960,data,(size_t)r_01);
      secp256k1_sha256_finalize(&sStack_960,auStack_980);
      secp256k1_scalar_set_b32((secp256k1_scalar *)r_02,auStack_980,(int *)0x0);
      return extraout_EAX;
    }
    if ((local_5e8[0x30] & 1) == 0) {
      pcStack_8d0 = (code *)0x10f465;
      iVar2 = secp256k1_fe_equal(&local_8b0,(secp256k1_fe *)local_5e8);
      return iVar2;
    }
    return 0;
  }
  pcStack_8d0 = (code *)0x10f477;
  secp256k1_schnorrsig_verify_cold_4();
  return 0;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32_limit(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal(&rx, &r.x);
}